

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptRegExpConstructor::GetEnumerator
          (JavascriptRegExpConstructor *this,JavascriptStaticEnumerator *enumerator,
          EnumeratorFlags flags,ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  BOOL BVar1;
  ScriptContext *this_00;
  Recycler *pRVar2;
  JavascriptRegExpEnumerator *this_01;
  TrackAllocData local_58;
  EnumeratorCache *local_30;
  EnumeratorCache *enumeratorCache_local;
  ScriptContext *requestContext_local;
  JavascriptStaticEnumerator *pJStack_18;
  EnumeratorFlags flags_local;
  JavascriptStaticEnumerator *enumerator_local;
  JavascriptRegExpConstructor *this_local;
  
  local_30 = enumeratorCache;
  enumeratorCache_local = (EnumeratorCache *)requestContext;
  requestContext_local._7_1_ = flags;
  pJStack_18 = enumerator;
  enumerator_local = (JavascriptStaticEnumerator *)this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pRVar2 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&JavascriptRegExpEnumerator::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
             ,0x2a);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_58);
  this_01 = (JavascriptRegExpEnumerator *)new<Memory::Recycler>(0x20,pRVar2,0x43c4b0);
  JavascriptRegExpEnumerator::JavascriptRegExpEnumerator
            (this_01,this,requestContext_local._7_1_,(ScriptContext *)enumeratorCache_local);
  BVar1 = DynamicObject::GetEnumeratorWithPrefix
                    ((DynamicObject *)this,(JavascriptEnumerator *)this_01,pJStack_18,
                     requestContext_local._7_1_,(ScriptContext *)enumeratorCache_local,local_30);
  return BVar1;
}

Assistant:

BOOL JavascriptRegExpConstructor::GetEnumerator(JavascriptStaticEnumerator * enumerator, EnumeratorFlags flags, ScriptContext* requestContext, EnumeratorCache * enumeratorCache)
    {
        return GetEnumeratorWithPrefix(
            RecyclerNew(GetScriptContext()->GetRecycler(), JavascriptRegExpEnumerator, this, flags, requestContext),
            enumerator, flags, requestContext, enumeratorCache);
    }